

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O0

plain_range_sorted<CLocalizationDatabase::CString>
find_binary<plain_range_sorted<CLocalizationDatabase::CString>,CLocalizationDatabase::CString>
          (plain_range_sorted<CLocalizationDatabase::CString> range,CString *value)

{
  plain_range<CLocalizationDatabase::CString> pVar1;
  bool bVar2;
  CString *pCVar3;
  CString *in_RDX;
  long in_FS_OFFSET;
  CString *in_stack_ffffffffffffff38;
  CString *in_stack_ffffffffffffff40;
  plain_range<CLocalizationDatabase::CString> in_stack_ffffffffffffff80;
  plain_range<CLocalizationDatabase::CString> local_40;
  plain_range<CLocalizationDatabase::CString> local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = in_RDX;
  CLocalizationDatabase::CString::CString(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  local_40 = (plain_range<CLocalizationDatabase::CString>)
             partition_binary<plain_range_sorted<CLocalizationDatabase::CString>,CLocalizationDatabase::CString>
                       ((plain_range_sorted<CLocalizationDatabase::CString>)
                        in_stack_ffffffffffffff80,pCVar3);
  CLocalizationDatabase::CString::~CString((CString *)0x1d6723);
  bVar2 = plain_range<CLocalizationDatabase::CString>::empty(&local_40);
  pVar1 = local_40;
  if (!bVar2) {
    pCVar3 = plain_range<CLocalizationDatabase::CString>::front
                       ((plain_range<CLocalizationDatabase::CString> *)in_stack_ffffffffffffff40);
    bVar2 = CLocalizationDatabase::CString::operator==(pCVar3,in_RDX);
    pVar1 = local_40;
    if (!bVar2) {
      plain_range_sorted<CLocalizationDatabase::CString>::plain_range_sorted
                ((plain_range_sorted<CLocalizationDatabase::CString> *)0x1d67cb);
      pVar1.end = local_30.end;
      pVar1.begin = local_30.begin;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    local_30 = pVar1;
    __stack_chk_fail();
  }
  return (plain_range_sorted<CLocalizationDatabase::CString>)pVar1;
}

Assistant:

R find_binary(R range, T value)
{
	range = partition_binary(range, value);
	if(range.empty()) return range;
	if(range.front() == value) return range;
	return R();
}